

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
wabt::Opcode::GetBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Opcode *this)

{
  pointer *ppuVar1;
  Enum EVar2;
  iterator iVar3;
  ulong uVar4;
  Offset OVar5;
  char cVar6;
  uint32_t value;
  uint8_t buffer [5];
  uchar local_1f;
  uchar local_1e;
  uint8_t local_1d [5];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EVar2 = this->enum_;
  uVar4 = (ulong)EVar2;
  if (uVar4 < 0x1c6) {
    cVar6 = infos_[uVar4 * 0x30 + 0x24];
  }
  else {
    cVar6 = (char)(-EVar2 >> 8);
  }
  if (cVar6 == '\0') {
    if (EVar2 < Invalid) {
      local_1f = (uchar)*(undefined4 *)(infos_ + uVar4 * 0x30 + 0x28);
    }
    else {
      local_1f = -(char)EVar2;
    }
    iVar3._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar3,&local_1f);
    }
    else {
      *iVar3._M_current = local_1f;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  else {
    if (EVar2 < Invalid) {
      local_1e = infos_[uVar4 * 0x30 + 0x24];
    }
    else {
      local_1e = (uchar)(-EVar2 >> 8);
    }
    iVar3._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar3,&local_1e);
    }
    else {
      *iVar3._M_current = local_1e;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    EVar2 = this->enum_;
    if ((ulong)EVar2 < 0x1c6) {
      value = *(uint32_t *)(infos_ + (ulong)EVar2 * 0x30 + 0x28);
    }
    else {
      value = -EVar2 & 0xff;
    }
    OVar5 = WriteU32Leb128Raw(local_1d,&stack0xffffffffffffffe8,value);
    if (OVar5 == 0) {
      __assert_fail("length != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/opcode.cc"
                    ,0x174,"std::vector<uint8_t> wabt::Opcode::GetBytes() const");
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_1d,local_1d + OVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Opcode::GetBytes() const {
  std::vector<uint8_t> result;
  if (HasPrefix()) {
    result.push_back(GetPrefix());
    uint8_t buffer[5];
    Offset length =
        WriteU32Leb128Raw(buffer, buffer + sizeof(buffer), GetCode());
    assert(length != 0);
    result.insert(result.end(), buffer, buffer + length);
  } else {
    result.push_back(GetCode());
  }
  return result;
}